

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,PolarSpeakerPosition *pos,
          bool isLfe,double tol)

{
  double start;
  double end;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  reference_const_type pdVar6;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *this_00;
  reference pvVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  VectorXd *this_01;
  double extraout_XMM0_Qa;
  pair<int,_double> pVar10;
  value_type local_298;
  RowXpr local_288;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
  local_250;
  RealScalar local_208;
  double distance;
  Channel channel;
  int i;
  double distMax;
  double distMin;
  double elMax;
  double elMin;
  double azMax;
  double azMin;
  PolarSpeakerPosition local_128;
  Vector3d local_60;
  Matrix<double,1,3,1,1,3> local_48 [8];
  RowVector3d cartPosition;
  double tol_local;
  bool isLfe_local;
  PolarSpeakerPosition *pos_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *candidates;
  
  cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [2] = tol;
  PolarSpeakerPosition::PolarSpeakerPosition(&local_128,pos);
  toCartesianVector3d(&local_60,&local_128);
  Eigen::Matrix<double,1,3,1,1,3>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
            (local_48,(EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_60);
  PolarSpeakerPosition::~PolarSpeakerPosition(&local_128);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (__return_storage_ptr__);
  pdVar6 = boost::get_optional_value_or<double>(&pos->azimuthMin,&pos->azimuth);
  start = *pdVar6;
  pdVar6 = boost::get_optional_value_or<double>(&pos->azimuthMax,&pos->azimuth);
  end = *pdVar6;
  pdVar6 = boost::get_optional_value_or<double>(&pos->elevationMin,&pos->elevation);
  dVar1 = *pdVar6;
  pdVar6 = boost::get_optional_value_or<double>(&pos->elevationMax,&pos->elevation);
  dVar2 = *pdVar6;
  pdVar6 = boost::get_optional_value_or<double>(&pos->distanceMin,&pos->distance);
  dVar3 = *pdVar6;
  pdVar6 = boost::get_optional_value_or<double>(&pos->distanceMax,&pos->distance);
  dVar4 = *pdVar6;
  channel._140_4_ = 0;
  do {
    if (this->_nChannels <= (int)channel._140_4_) {
      return __return_storage_ptr__;
    }
    this_00 = Layout::channels(&this->_layout);
    pvVar7 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::operator[]
                       (this_00,(long)(int)channel._140_4_);
    Channel::Channel((Channel *)&distance,pvVar7);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<bool,__1,_1,_0,__1,_1>,_1> *)&this->_isLfe,
                        (long)(int)channel._140_4_);
    if (isLfe == (bool)(*pSVar8 & 1U)) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->_azimuths,(long)(int)channel._140_4_);
      bVar5 = insideAngleRange(*pSVar9,start,end,
                               cartPosition.
                               super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                               m_storage.m_data.array[2]);
      if (!bVar5) {
        this_01 = &this->_elevations;
        Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                  ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                   (long)(int)channel._140_4_);
        std::abs((int)this_01);
        if (extraout_XMM0_Qa <
            90.0 - cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[2]) goto LAB_0022a564;
      }
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          &this->_elevations,(long)(int)channel._140_4_);
      if ((((dVar1 - cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                     m_storage.m_data.array[2] < *pSVar9) &&
           (pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &this->_elevations,(long)(int)channel._140_4_),
           *pSVar9 < dVar2 + cartPosition.
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                             m_data.array[2])) &&
          (pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &this->_distances,(long)(int)channel._140_4_),
          dVar3 - cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                  m_storage.m_data.array[2] < *pSVar9)) &&
         (pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &this->_distances,(long)(int)channel._140_4_),
         *pSVar9 < dVar4 + cartPosition.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                           .m_storage.m_data.array[2])) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_288,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->_positions,
                   (long)(int)channel._140_4_);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator-
                  (&local_250,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>> *)
                   &local_288,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_48);
        local_208 = Eigen::
                    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                    ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                            *)&local_250);
        pVar10 = std::make_pair<int&,double&>((int *)&channel.field_0x8c,&local_208);
        local_298.second = pVar10.second;
        local_298.first = pVar10.first;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                  (__return_storage_ptr__,&local_298);
      }
    }
LAB_0022a564:
    Channel::~Channel((Channel *)&distance);
    channel._140_4_ = channel._140_4_ + 1;
  } while( true );
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const PolarSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;
    double azMin = boost::get_optional_value_or(pos.azimuthMin, pos.azimuth);
    double azMax = boost::get_optional_value_or(pos.azimuthMax, pos.azimuth);
    double elMin =
        boost::get_optional_value_or(pos.elevationMin, pos.elevation);
    double elMax =
        boost::get_optional_value_or(pos.elevationMax, pos.elevation);
    double distMin =
        boost::get_optional_value_or(pos.distanceMin, pos.distance);
    double distMax =
        boost::get_optional_value_or(pos.distanceMax, pos.distance);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if ((insideAngleRange(_azimuths(i), azMin, azMax, tol) ||
             std::abs(_elevations(i)) >= 90.0 - tol) &&
            (_elevations(i) > elMin - tol) && (_elevations(i) < elMax + tol) &&
            (_distances(i) > distMin - tol) &&
            (_distances(i) < distMax + tol)) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }